

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t mbedtls_to_psa_error(int ret)

{
  int local_14;
  int ret_local;
  
  local_14 = ret;
  if (ret < -0x7f) {
    local_14 = -(-ret & 0x7f80U);
  }
  if (local_14 == -0x6400) {
    return -0x93;
  }
  if (local_14 == -0x6380) {
    return -0x97;
  }
  if (local_14 == -0x6300) {
    return -0x95;
  }
  if (local_14 == -0x6280) {
    return -0x89;
  }
  if (local_14 == -0x6200) {
    return -0x96;
  }
  if (local_14 == -0x6180) {
    return -0x8d;
  }
  if (local_14 == -0x6100) {
    return -0x87;
  }
  if (local_14 == -0x6080) {
    return -0x86;
  }
  if (local_14 == -0x5280) {
    return -0x93;
  }
  if (local_14 == -0x5200) {
    return -0x92;
  }
  if (local_14 == -0x5180) {
    return -0x8d;
  }
  if (local_14 == -0x5100) {
    return -0x87;
  }
  if (local_14 == -0x5080) {
    return -0x86;
  }
  if (local_14 == -0x4f80) {
    return -0x87;
  }
  if (local_14 == -0x4f00) {
    return -0x8a;
  }
  if (local_14 == -0x4e80) {
    return -0x86;
  }
  if (local_14 != -0x4e00) {
    if (local_14 == -0x4d80) {
      return -0x8d;
    }
    if (local_14 == -0x4c80) {
      return -0x87;
    }
    if (local_14 != -0x4c00) {
      if (local_14 == -0x4b80) {
        return -0x93;
      }
      if (local_14 == -0x4580) {
        return -0x93;
      }
      if (local_14 == -0x4500) {
        return -0x86;
      }
      if (local_14 == -0x4480) {
        return -0x8d;
      }
      if (local_14 == -0x4400) {
        return -0x8a;
      }
      if (local_14 == -0x4380) {
        return -0x95;
      }
      if ((local_14 == -0x4300) || (local_14 == -0x4280)) {
        return -0x97;
      }
      if (local_14 == -0x4200) {
        return -0x87;
      }
      if (local_14 == -0x4180) {
        return -0x93;
      }
      if (local_14 == -0x4100) {
        return -0x96;
      }
      if (local_14 == -0x4080) {
        return -0x87;
      }
      if (local_14 == -0x3f80) {
        return -0x8d;
      }
      if ((local_14 == -0x3f00) || (local_14 == -16000)) {
        return -0x87;
      }
      if (local_14 == -0x3e00) {
        return -0x92;
      }
      if ((local_14 == -0x3d80) || (local_14 == -0x3d00)) {
        return -0x87;
      }
      if (local_14 == -0x3c80) {
        return -0x86;
      }
      if ((local_14 != -0x3c00) && (local_14 != -0x3b80)) {
        if (local_14 == -0x3b00) {
          return -0x87;
        }
        if (((local_14 == -0x3a80) || (local_14 == -0x3a00)) || (local_14 == -0x3980)) {
          return -0x86;
        }
        if (local_14 == -0x3900) {
          return -0x95;
        }
        if (local_14 == -0x3880) {
          return -0x93;
        }
        if (local_14 == -0x7a) {
          return -0x93;
        }
        if (local_14 == -0x72) {
          return -0x86;
        }
        if (local_14 == -0x70) {
          return -0x93;
        }
        if (local_14 == -0x6e) {
          return -0x97;
        }
        if (local_14 == -0x6c) {
          return -0x8a;
        }
        if (local_14 == -0x6a) {
          return -0x8d;
        }
        if (((local_14 == -0x68) || (local_14 == -0x66)) ||
           ((local_14 == -100 || ((local_14 == -0x62 || (local_14 == -0x60)))))) {
          return -0x87;
        }
        if (local_14 == -0x56) {
          return -0x95;
        }
        if (local_14 == -0x54) {
          return -0x89;
        }
        if (local_14 == -0x51) {
          return -0x87;
        }
        if ((local_14 == -0x40) || (local_14 + 0x3dU < 2)) {
          return -0x94;
        }
        if (local_14 == -0x3a) {
          return -0x94;
        }
        if (local_14 != -0x39) {
          if (local_14 == -0x38) {
            return -0x86;
          }
          if (local_14 != -0x37) {
            if (local_14 == -0x36) {
              return -0x86;
            }
            if (local_14 != -0x35) {
              if (local_14 == -0x34) {
                return -0x94;
              }
              if (local_14 == -0x33) {
                return -0x93;
              }
              if (local_14 == -0x32) {
                return -0x86;
              }
              if (local_14 == -0x31) {
                return -0x93;
              }
              if (((local_14 == -0x2f) || (local_14 == -0x2d)) || (local_14 == -0x2b)) {
                return -0x93;
              }
              if (local_14 == -0x29) {
                return -0x93;
              }
              if (local_14 == -0x28) {
                return -0x87;
              }
              if (local_14 == -0x27) {
                return -0x93;
              }
              if (local_14 != -0x26) {
                if (local_14 == -0x25) {
                  return -0x93;
                }
                if (local_14 != -0x24) {
                  if ((local_14 + 0x23U < 2) || (local_14 == -0x20)) {
                    return -0x86;
                  }
                  if (local_14 == -0x19) {
                    return -0x93;
                  }
                  if (local_14 != -0x18) {
                    if (local_14 == -0x17) {
                      return -0x93;
                    }
                    if (local_14 != -0x16) {
                      if (local_14 == -0x14) {
                        return -0x87;
                      }
                      if (local_14 == -0x13) {
                        return -0x93;
                      }
                      if (local_14 == -0x12) {
                        return -0x95;
                      }
                      if (local_14 == -0x11) {
                        return -0x93;
                      }
                      if (local_14 == -0x10) {
                        return -0x8d;
                      }
                      if (local_14 == -0xf) {
                        return -0x95;
                      }
                      if (local_14 == -0xe) {
                        return -0x87;
                      }
                      if (local_14 == -0xd) {
                        return -0x87;
                      }
                      if (local_14 == -0xc) {
                        return -0x87;
                      }
                      if (local_14 == -10) {
                        return -0x87;
                      }
                      if (local_14 == -8) {
                        return -0x8a;
                      }
                      if (local_14 == -6) {
                        return -0x87;
                      }
                      if (local_14 == -4) {
                        return -0x87;
                      }
                      if (local_14 == -2) {
                        return -0x92;
                      }
                      if (local_14 != 0) {
                        return -0x84;
                      }
                      return 0;
                    }
                  }
                  return -0x86;
                }
              }
              return -0x86;
            }
          }
        }
        return -0x93;
      }
      return -0x85;
    }
  }
  return -0x95;
}

Assistant:

static psa_status_t mbedtls_to_psa_error( int ret )
{
    /* If there's both a high-level code and low-level code, dispatch on
     * the high-level code. */
    switch( ret < -0x7f ? - ( -ret & 0x7f80 ) : ret )
    {
        case 0:
            return( PSA_SUCCESS );

        case MBEDTLS_ERR_AES_INVALID_KEY_LENGTH:
        case MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH:
        case MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_AES_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_ARC4_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_ASN1_OUT_OF_DATA:
        case MBEDTLS_ERR_ASN1_UNEXPECTED_TAG:
        case MBEDTLS_ERR_ASN1_INVALID_LENGTH:
        case MBEDTLS_ERR_ASN1_LENGTH_MISMATCH:
        case MBEDTLS_ERR_ASN1_INVALID_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_ASN1_ALLOC_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        case MBEDTLS_ERR_ASN1_BUF_TOO_SMALL:
            return( PSA_ERROR_BUFFER_TOO_SMALL );

#if defined(MBEDTLS_ERR_BLOWFISH_BAD_INPUT_DATA)
        case MBEDTLS_ERR_BLOWFISH_BAD_INPUT_DATA:
#elif defined(MBEDTLS_ERR_BLOWFISH_INVALID_KEY_LENGTH)
        case MBEDTLS_ERR_BLOWFISH_INVALID_KEY_LENGTH:
#endif
        case MBEDTLS_ERR_BLOWFISH_INVALID_INPUT_LENGTH:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_BLOWFISH_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

#if defined(MBEDTLS_ERR_CAMELLIA_BAD_INPUT_DATA)
        case MBEDTLS_ERR_CAMELLIA_BAD_INPUT_DATA:
#elif defined(MBEDTLS_ERR_CAMELLIA_INVALID_KEY_LENGTH)
        case MBEDTLS_ERR_CAMELLIA_INVALID_KEY_LENGTH:
#endif
        case MBEDTLS_ERR_CAMELLIA_INVALID_INPUT_LENGTH:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_CAMELLIA_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_CCM_BAD_INPUT:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_CCM_AUTH_FAILED:
            return( PSA_ERROR_INVALID_SIGNATURE );
        case MBEDTLS_ERR_CCM_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_CHACHA20_BAD_INPUT_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );

        case MBEDTLS_ERR_CHACHAPOLY_BAD_STATE:
            return( PSA_ERROR_BAD_STATE );
        case MBEDTLS_ERR_CHACHAPOLY_AUTH_FAILED:
            return( PSA_ERROR_INVALID_SIGNATURE );

        case MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_CIPHER_ALLOC_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        case MBEDTLS_ERR_CIPHER_INVALID_PADDING:
            return( PSA_ERROR_INVALID_PADDING );
        case MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED:
            return( PSA_ERROR_BAD_STATE );
        case MBEDTLS_ERR_CIPHER_AUTH_FAILED:
            return( PSA_ERROR_INVALID_SIGNATURE );
        case MBEDTLS_ERR_CIPHER_INVALID_CONTEXT:
            return( PSA_ERROR_CORRUPTION_DETECTED );
        case MBEDTLS_ERR_CIPHER_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_CMAC_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED:
            return( PSA_ERROR_INSUFFICIENT_ENTROPY );
        case MBEDTLS_ERR_CTR_DRBG_REQUEST_TOO_BIG:
        case MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR:
            return( PSA_ERROR_INSUFFICIENT_ENTROPY );

        case MBEDTLS_ERR_DES_INVALID_INPUT_LENGTH:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_DES_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED:
        case MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE:
        case MBEDTLS_ERR_ENTROPY_SOURCE_FAILED:
            return( PSA_ERROR_INSUFFICIENT_ENTROPY );

        case MBEDTLS_ERR_GCM_AUTH_FAILED:
            return( PSA_ERROR_INVALID_SIGNATURE );
        case MBEDTLS_ERR_GCM_BAD_INPUT:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_GCM_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_MD2_HW_ACCEL_FAILED:
        case MBEDTLS_ERR_MD4_HW_ACCEL_FAILED:
        case MBEDTLS_ERR_MD5_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_MD_FEATURE_UNAVAILABLE:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_MD_BAD_INPUT_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_MD_ALLOC_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        case MBEDTLS_ERR_MD_FILE_IO_ERROR:
            return( PSA_ERROR_STORAGE_FAILURE );
        case MBEDTLS_ERR_MD_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_MPI_FILE_IO_ERROR:
            return( PSA_ERROR_STORAGE_FAILURE );
        case MBEDTLS_ERR_MPI_BAD_INPUT_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_MPI_INVALID_CHARACTER:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL:
            return( PSA_ERROR_BUFFER_TOO_SMALL );
        case MBEDTLS_ERR_MPI_NEGATIVE_VALUE:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_MPI_DIVISION_BY_ZERO:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_MPI_NOT_ACCEPTABLE:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_MPI_ALLOC_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );

        case MBEDTLS_ERR_PK_ALLOC_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        case MBEDTLS_ERR_PK_TYPE_MISMATCH:
        case MBEDTLS_ERR_PK_BAD_INPUT_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_PK_FILE_IO_ERROR:
            return( PSA_ERROR_STORAGE_FAILURE );
        case MBEDTLS_ERR_PK_KEY_INVALID_VERSION:
        case MBEDTLS_ERR_PK_KEY_INVALID_FORMAT:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_PK_UNKNOWN_PK_ALG:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_PK_PASSWORD_REQUIRED:
        case MBEDTLS_ERR_PK_PASSWORD_MISMATCH:
            return( PSA_ERROR_NOT_PERMITTED );
        case MBEDTLS_ERR_PK_INVALID_PUBKEY:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_PK_INVALID_ALG:
        case MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE:
        case MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_PK_SIG_LEN_MISMATCH:
            return( PSA_ERROR_INVALID_SIGNATURE );
        case MBEDTLS_ERR_PK_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );
        case MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED:
            return( PSA_ERROR_NOT_SUPPORTED );

        case MBEDTLS_ERR_RIPEMD160_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_RSA_BAD_INPUT_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_RSA_INVALID_PADDING:
            return( PSA_ERROR_INVALID_PADDING );
        case MBEDTLS_ERR_RSA_KEY_GEN_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );
        case MBEDTLS_ERR_RSA_KEY_CHECK_FAILED:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_RSA_PUBLIC_FAILED:
        case MBEDTLS_ERR_RSA_PRIVATE_FAILED:
            return( PSA_ERROR_CORRUPTION_DETECTED );
        case MBEDTLS_ERR_RSA_VERIFY_FAILED:
            return( PSA_ERROR_INVALID_SIGNATURE );
        case MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE:
            return( PSA_ERROR_BUFFER_TOO_SMALL );
        case MBEDTLS_ERR_RSA_RNG_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        case MBEDTLS_ERR_RSA_UNSUPPORTED_OPERATION:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_RSA_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_SHA1_HW_ACCEL_FAILED:
        case MBEDTLS_ERR_SHA256_HW_ACCEL_FAILED:
        case MBEDTLS_ERR_SHA512_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_XTEA_INVALID_INPUT_LENGTH:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_XTEA_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_ECP_BAD_INPUT_DATA:
        case MBEDTLS_ERR_ECP_INVALID_KEY:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL:
            return( PSA_ERROR_BUFFER_TOO_SMALL );
        case MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH:
        case MBEDTLS_ERR_ECP_VERIFY_FAILED:
            return( PSA_ERROR_INVALID_SIGNATURE );
        case MBEDTLS_ERR_ECP_ALLOC_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        case MBEDTLS_ERR_ECP_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );
        case MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED:
            return( PSA_ERROR_CORRUPTION_DETECTED );

        default:
            return( PSA_ERROR_GENERIC_ERROR );
    }
}